

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O0

void __thiscall
chrono::ChClassRegistration<myEmployeeBoss>::~ChClassRegistration
          (ChClassRegistration<myEmployeeBoss> *this)

{
  ChClassRegistration<myEmployeeBoss> *this_local;
  
  ~ChClassRegistration(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~ChClassRegistration() {

        // register in global class factory
        ChClassFactory::ClassUnregister(this->m_sTagName);
    }